

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void pi_destroy_v2(opj_pi_iterator_t *p_pi,OPJ_UINT32 p_nb_elements)

{
  uint in_ESI;
  void *in_RDI;
  opj_pi_comp_t *l_current_component;
  opj_pi_iterator_t *l_current_pi;
  OPJ_UINT32 pino;
  OPJ_UINT32 compno;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined4 local_10;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
      *(undefined8 *)((long)in_RDI + 8) = 0;
    }
    local_20 = in_RDI;
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (*(long *)((long)local_20 + 0xd0) != 0) {
        local_28 = *(long *)((long)local_20 + 0xd0);
        for (local_10 = 0; local_10 < *(uint *)((long)local_20 + 200); local_10 = local_10 + 1) {
          if (*(long *)(local_28 + 0x10) != 0) {
            free(*(void **)(local_28 + 0x10));
            *(undefined8 *)(local_28 + 0x10) = 0;
          }
          local_28 = local_28 + 0x18;
        }
        free(*(void **)((long)local_20 + 0xd0));
        *(undefined8 *)((long)local_20 + 0xd0) = 0;
      }
      local_20 = (void *)((long)local_20 + 0xf8);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void pi_destroy_v2(
				opj_pi_iterator_t *p_pi,
				OPJ_UINT32 p_nb_elements)
{
	OPJ_UINT32 compno, pino;
	opj_pi_iterator_t *l_current_pi = p_pi;
	if
		(p_pi)
	{
		if
			(p_pi->include)
		{
			opj_free(p_pi->include);
			p_pi->include = 00;
		}
		// TODO
		for
			(pino = 0; pino < p_nb_elements; ++pino)
		{
			if
				(l_current_pi->comps)
			{
				opj_pi_comp_t *l_current_component = l_current_pi->comps;
				for
					(compno = 0; compno < l_current_pi->numcomps; compno++)
				{
					if
						(l_current_component->resolutions)
					{
						opj_free(l_current_component->resolutions);
						l_current_component->resolutions = 00;
					}
					++l_current_component;
				}
				opj_free(l_current_pi->comps);
				l_current_pi->comps = 0;
			}
			++l_current_pi;
		}
		opj_free(p_pi);
	}
}